

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O0

void __thiscall
inject::not_providing::not_providing
          (not_providing *this,unique_id bound_component_id,unique_id interface_id)

{
  ostream *poVar1;
  string local_1c8 [32];
  stringstream local_1a8 [8];
  stringstream oss;
  ostream local_198 [376];
  unique_id local_20;
  unique_id interface_id_local;
  unique_id bound_component_id_local;
  not_providing *this_local;
  
  local_20 = interface_id;
  interface_id_local = bound_component_id;
  bound_component_id_local = (unique_id)this;
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__not_providing_00127d38;
  this->_bound_id = interface_id_local;
  this->_interface_id = local_20;
  std::__cxx11::string::string((string *)&this->_msg);
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,"component ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,interface_id_local);
  poVar1 = std::operator<<(poVar1," is bound as implementing component ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20);
  std::operator<<(poVar1," but isn\'t registered as providing it");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)&this->_msg,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

not_providing(
            unique_id bound_component_id,
            unique_id interface_id) throw() :
            exception(),
            _bound_id(bound_component_id),
            _interface_id(interface_id) {
        std::stringstream oss;
        oss <<
            "component " << bound_component_id <<
            " is bound as implementing component " << interface_id <<
            " but isn't registered as providing it";
        _msg = oss.str();
    }